

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

int __thiscall
yy::parser::context::expected_tokens(context *this,symbol_kind_type *yyarg,int yyargn)

{
  bool bVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  
  if (this->yyparser_->yy_lac_established_ == false) {
    yy_lac_check_(this->yyparser_,
                  (this->yyla_->super_basic_symbol<yy::parser::by_kind>).super_by_kind.kind_);
  }
  iVar3 = 0;
  for (uVar4 = 0xfffffffd; uVar4 != 0x10; uVar4 = uVar4 + 1) {
    if (uVar4 < 0xfffffffe) {
      bVar1 = yy_lac_check_(this->yyparser_,uVar4 + S_UTF8_BOM);
      if (bVar1) {
        if (yyarg == (symbol_kind_type *)0x0) {
          iVar3 = iVar3 + 1;
        }
        else {
          if (iVar3 == yyargn) goto LAB_00105889;
          lVar2 = (long)iVar3;
          iVar3 = iVar3 + 1;
          yyarg[lVar2] = uVar4 + S_UTF8_BOM;
        }
      }
    }
  }
  if (((0 < yyargn) && (yyarg != (symbol_kind_type *)0x0)) && (iVar3 == 0)) {
    *yyarg = S_YYEMPTY;
LAB_00105889:
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int
  parser::context::expected_tokens (symbol_kind_type yyarg[], int yyargn) const
  {
    // Actual number of expected tokens
    int yycount = 0;

#if YYDEBUG
    // Execute LAC once. We don't care if it is successful, we
    // only do it for the sake of debugging output.
    if (!yyparser_.yy_lac_established_)
      yyparser_.yy_lac_check_ (yyla_.kind ());
#endif

    for (int yyx = 0; yyx < YYNTOKENS; ++yyx)
      {
        symbol_kind_type yysym = YY_CAST (symbol_kind_type, yyx);
        if (yysym != symbol_kind::S_YYerror
            && yysym != symbol_kind::S_YYUNDEF
            && yyparser_.yy_lac_check_ (yysym))
          {
            if (!yyarg)
              ++yycount;
            else if (yycount == yyargn)
              return 0;
            else
              yyarg[yycount++] = yysym;
          }
      }
    if (yyarg && yycount == 0 && 0 < yyargn)
      yyarg[0] = symbol_kind::S_YYEMPTY;
    return yycount;
  }